

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_123::LimitedInputStream::decreaseLimit
          (LimitedInputStream *this,uint64_t amount,uint64_t requested)

{
  AsyncInputStream *pAVar1;
  Disposer *pDVar2;
  char *pcVar3;
  size_t sVar4;
  char (*params) [36];
  Fault f;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  String local_1c8;
  Fault local_1b0;
  uint64_t local_1a8;
  undefined1 local_1a0 [400];
  
  local_1a0._8_8_ = &local_1a8;
  local_1a0._0_8_ = &this->limit;
  local_1a0._16_8_ = " >= ";
  local_1a0._24_8_ = &DAT_00000005;
  local_1a0[0x20] = amount <= this->limit;
  local_1a8 = amount;
  if (local_1a0[0x20]) {
    params = (char (*) [36])(this->limit - amount);
    *(char (**) [36])local_1a0._0_8_ = params;
    if (params == (char (*) [36])0x0) {
      pAVar1 = (this->inner).ptr;
      if (pAVar1 != (AsyncInputStream *)0x0) {
        (this->inner).ptr = (AsyncInputStream *)0x0;
        pDVar2 = (this->inner).disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,pAVar1->_vptr_AsyncInputStream[-2] + (long)&pAVar1->_vptr_AsyncInputStream
                  );
      }
    }
    else if (amount < requested) {
      kj::_::Debug::makeDescription<char_const(&)[36]>
                (&local_1c8,(Debug *)"\"fixed-length pipe ended prematurely\"",
                 "fixed-length pipe ended prematurely",params);
      Exception::Exception
                ((Exception *)local_1a0,DISCONNECTED,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x69f,&local_1c8);
      throwRecoverableException((Exception *)local_1a0,0);
      Exception::~Exception((Exception *)local_1a0);
      sVar4 = local_1c8.content.size_;
      pcVar3 = local_1c8.content.ptr;
      if (local_1c8.content.ptr != (char *)0x0) {
        local_1c8.content.ptr = (char *)0x0;
        local_1c8.content.size_ = 0;
        (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
                  (local_1c8.content.disposer,pcVar3,1,sVar4,sVar4,0);
      }
    }
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x699,FAILED,"limit >= amount","_kjCondition,",
             (DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_1a0);
  kj::_::Debug::Fault::fatal(&local_1b0);
}

Assistant:

void decreaseLimit(uint64_t amount, uint64_t requested) {
    KJ_ASSERT(limit >= amount);
    limit -= amount;
    if (limit == 0) {
      inner = nullptr;
    } else if (amount < requested) {
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED,
          "fixed-length pipe ended prematurely"));
    }
  }